

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int use_privatekey_blob(SSL_CTX *ctx,curl_blob *blob,int type,char *key_passwd)

{
  BIO *bp;
  BIO *in;
  EVP_PKEY *pkey;
  int ret;
  char *key_passwd_local;
  int type_local;
  curl_blob *blob_local;
  SSL_CTX *ctx_local;
  
  pkey._4_4_ = 0;
  bp = BIO_new_mem_buf(blob->data,(int)blob->len);
  if (bp == (BIO *)0x0) {
    return 0x1b;
  }
  if (type == 1) {
    in = (BIO *)PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)0x0,passwd_callback,key_passwd);
  }
  else {
    if (type != 2) goto LAB_001b7bc3;
    in = (BIO *)d2i_PrivateKey_bio(bp,(EVP_PKEY **)0x0);
  }
  if (in != (BIO *)0x0) {
    pkey._4_4_ = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,(EVP_PKEY *)in);
    EVP_PKEY_free((EVP_PKEY *)in);
  }
LAB_001b7bc3:
  BIO_free(bp);
  return pkey._4_4_;
}

Assistant:

static int use_privatekey_blob(SSL_CTX *ctx, const struct curl_blob *blob,
                               int type, const char *key_passwd)
{
  int ret = 0;
  EVP_PKEY *pkey = NULL;
  BIO *in = BIO_new_mem_buf(blob->data, (int)(blob->len));
  if(!in)
    return CURLE_OUT_OF_MEMORY;

  if(type == SSL_FILETYPE_PEM)
    pkey = PEM_read_bio_PrivateKey(in, NULL, passwd_callback,
                                   CURL_UNCONST(key_passwd));
  else if(type == SSL_FILETYPE_ASN1)
    pkey = d2i_PrivateKey_bio(in, NULL);
  else
    goto end;

  if(!pkey)
    goto end;

  ret = SSL_CTX_use_PrivateKey(ctx, pkey);
  EVP_PKEY_free(pkey);
end:
  BIO_free(in);
  return ret;
}